

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O1

int drive_compressor(archive_write_filter *f,private_data_conflict8 *data,int finishing,void *src,
                    size_t length)

{
  ZSTD_outBuffer *output;
  archive *a;
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  int unaff_R12D;
  ZSTD_inBuffer in;
  ZSTD_inBuffer local_48;
  
  local_48.pos = 0;
  output = &data->out;
  local_48.src = src;
  local_48.size = length;
  do {
    sVar4 = (data->out).size;
    if ((data->out).pos == sVar4) {
      iVar2 = __archive_write_filter(f->next_filter,output->dst,sVar4);
      if (iVar2 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
    }
    if (finishing == 0) {
      if (local_48.pos == local_48.size) {
        return 0;
      }
      sVar4 = ZSTD_compressStream(data->cstream,output,&local_48);
    }
    else {
      sVar4 = ZSTD_endStream(data->cstream,output);
    }
    uVar3 = ZSTD_isError(sVar4);
    if (uVar3 == 0) {
      bVar1 = true;
      if ((finishing != 0) && (sVar4 == 0)) {
        unaff_R12D = __archive_write_filter(f->next_filter,(data->out).dst,(data->out).pos);
        bVar1 = false;
      }
    }
    else {
      a = f->archive;
      pcVar5 = ZSTD_getErrorName(sVar4);
      bVar1 = false;
      archive_set_error(a,-1,"Zstd compression failed: %s",pcVar5);
      unaff_R12D = -0x1e;
    }
  } while (bVar1);
  return unaff_R12D;
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing, const void *src, size_t length)
{
	ZSTD_inBuffer in = (ZSTD_inBuffer) { src, length, 0 };

	for (;;) {
		if (data->out.pos == data->out.size) {
			const int ret = __archive_write_filter(f->next_filter,
			    data->out.dst, data->out.size);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			data->out.pos = 0;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && in.pos == in.size)
			return (ARCHIVE_OK);

		{
			const size_t zstdret = !finishing ?
			    ZSTD_compressStream(data->cstream, &data->out, &in)
			    : ZSTD_endStream(data->cstream, &data->out);

			if (ZSTD_isError(zstdret)) {
				archive_set_error(f->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Zstd compression failed: %s",
				    ZSTD_getErrorName(zstdret));
				return (ARCHIVE_FATAL);
			}

			/* If we're finishing, 0 means nothing left to flush */
			if (finishing && zstdret == 0) {
				const int ret = __archive_write_filter(f->next_filter,
				    data->out.dst, data->out.pos);
				return (ret);
			}
		}
	}
}